

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

exr_result_t exr_attr_string_init_static(exr_context_t ctxt,exr_attr_string_t *s,char *v)

{
  exr_result_t eVar1;
  exr_attr_string_t *in_RDX;
  exr_context_t in_RSI;
  long in_RDI;
  int32_t length;
  size_t fulllen;
  int32_t len;
  char *v_00;
  
  v_00 = (char *)0x0;
  len = 0;
  if (in_RDX != (exr_attr_string_t *)0x0) {
    v_00 = (char *)strlen((char *)in_RDX);
    if ((char *)0x7ffffffe < v_00) {
      if (in_RDI == 0) {
        return 2;
      }
      eVar1 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Invalid string too long for attribute");
      return eVar1;
    }
    len = (int32_t)v_00;
  }
  eVar1 = exr_attr_string_init_static_with_length(in_RSI,in_RDX,v_00,len);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_string_init_static (
    exr_context_t ctxt, exr_attr_string_t* s, const char* v)
{
    size_t  fulllen = 0;
    int32_t length  = 0;

    if (v)
    {
        fulllen = strlen (v);
        if (fulllen >= (size_t) INT32_MAX)
        {
            if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
            return ctxt->report_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid string too long for attribute");
        }
        length = (int32_t) fulllen;
    }
    return exr_attr_string_init_static_with_length (ctxt, s, v, length);
}